

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::on_expire(upnp *this,error_code *ec)

{
  time_point tVar1;
  duration dVar2;
  _Base_ptr p_Var3;
  duration dVar4;
  port_mapping_t m;
  long lVar5;
  long lVar6;
  time_point next_expire;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  _Bind<void_(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_50;
  
  if ((ec->failed_ == false) && (this->m_closing == false)) {
    tVar1 = aux::time_now();
    next_expire.__d.__r = (duration)0x7fffffffffffffff;
    dVar4.__r = 0x7fffffffffffffff;
    for (p_Var3 = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->m_devices)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3)) {
      if (*(byte *)((long)&p_Var3[8]._M_color + 2) == 0) {
        lVar6 = 0;
        for (lVar5 = 0;
            lVar5 < (int)(((long)(this->m_mappings).
                                 super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                 .
                                 super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_mappings).
                                super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                .
                                super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x48);
            lVar5 = lVar5 + 1) {
          dVar2.__r = *(long *)(*(long *)(p_Var3 + 4) + lVar6);
          if (dVar2.__r != 0x7fffffffffffffff) {
            if (dVar2.__r <= (long)tVar1.__d.__r) {
              *(undefined1 *)(*(long *)(p_Var3 + 4) + 8 + lVar6) = 1;
              update_map(this,(rootdevice *)(p_Var3 + 1),(port_mapping_t)(int)lVar5);
              dVar2.__r = *(long *)(*(long *)(p_Var3 + 4) + lVar6);
            }
            if (dVar2.__r < dVar4.__r) {
              dVar4.__r = dVar2.__r;
              next_expire.__d.__r = (duration)(duration)dVar2.__r;
            }
          }
          lVar6 = lVar6 + 0x58;
        }
      }
    }
    if (dVar4.__r != 0x7fffffffffffffff) {
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::expires_at(&this->m_refresh_timer,&next_expire);
      ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::upnp,void>
                ((__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                 (__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_50._M_f = (offset_in_upnp_to_subr)on_expire;
      local_50._8_8_ = 0;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
      local_50._M_bound_args.
      super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>._M_head_impl.
      super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           a_Stack_60[0]._M_pi;
      local_68 = (element_type *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
      ::
      async_wait<std::_Bind<void(libtorrent::upnp::*(std::shared_ptr<libtorrent::upnp>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                ((basic_waitable_timer<std::chrono::_V2::system_clock,boost::asio::wait_traits<std::chrono::_V2::system_clock>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  *)&this->m_refresh_timer,&local_50);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_50._M_bound_args.
                         super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::upnp>,_std::_Placeholder<1>_>
                         .super__Head_base<0UL,_std::shared_ptr<libtorrent::upnp>,_false>.
                         _M_head_impl.
                         super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> + 8));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
    }
  }
  return;
}

Assistant:

void upnp::on_expire(error_code const& ec)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::on_expire");
	if (ec) return;

	if (m_closing) return;

	time_point const now = aux::time_now();
	time_point next_expire = max_time();

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;
		for (port_mapping_t m{0}; m < m_mappings.end_index(); ++m)
		{
			if (d.mapping[m].expires == max_time())
				continue;

			if (d.mapping[m].expires <= now)
			{
				d.mapping[m].act = portmap_action::add;
				update_map(d, m);
			}
			if (d.mapping[m].expires < next_expire)
			{
				next_expire = d.mapping[m].expires;
			}
		}
	}
	if (next_expire != max_time())
	{
		ADD_OUTSTANDING_ASYNC("upnp::on_expire");
		m_refresh_timer.expires_at(next_expire);
		m_refresh_timer.async_wait(std::bind(&upnp::on_expire, self(), _1));
	}
}